

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

void Gia_ManCycle(Gia_Man_t *p,Abc_Cex_t *pCex,int nFrames)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  long lVar7;
  Gia_Obj_t *pGVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  
  Gia_ManRandom(1);
  if ((pCex != (Abc_Cex_t *)0x0) && (pCex->iFrame < nFrames)) {
    __assert_fail("pCex == NULL || nFrames <= pCex->iFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x287,"void Gia_ManCycle(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  if (0 < nFrames) {
    iVar11 = 0;
    do {
      pVVar5 = p->vCis;
      uVar9 = (ulong)(uint)pVVar5->nSize;
      if (p->nRegs < pVVar5->nSize) {
        lVar10 = 0;
        do {
          if ((int)uVar9 <= lVar10) goto LAB_001da43f;
          iVar6 = pVVar5->pArray[lVar10];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_001da420;
          pGVar8 = p->pObjs;
          if (pGVar8 == (Gia_Obj_t *)0x0) break;
          if (pCex == (Abc_Cex_t *)0x0) {
            uVar3 = Gia_ManRandom(0);
          }
          else {
            lVar7 = (ulong)(uint)(pCex->nPis * iVar11 + pCex->nRegs) + lVar10;
            uVar3 = (uint)(&pCex[1].iPo)[(int)lVar7 >> 5] >> ((byte)lVar7 & 0x1f);
          }
          pGVar8 = pGVar8 + iVar6;
          *(ulong *)pGVar8 = *(ulong *)pGVar8 & 0xffffffffbfffffff | (ulong)((uVar3 & 1) << 0x1e);
          lVar10 = lVar10 + 1;
          pVVar5 = p->vCis;
          uVar9 = (ulong)pVVar5->nSize;
        } while (lVar10 < (long)(uVar9 - (long)p->nRegs));
      }
      if (0 < p->nObjs) {
        lVar10 = 0;
        lVar7 = 0;
        do {
          pGVar8 = p->pObjs;
          if (pGVar8 == (Gia_Obj_t *)0x0) break;
          uVar9 = *(ulong *)(&pGVar8->field_0x0 + lVar10);
          if ((uVar9 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar9) {
            *(ulong *)(&pGVar8->field_0x0 + lVar10) =
                 uVar9 & 0xffffffff3fffffff |
                 (ulong)((((uint)(uVar9 >> 0x3d) ^
                          *(uint *)((long)pGVar8 +
                                   (ulong)((uint)(uVar9 >> 0x1e) & 0x7ffffffc) * -3 + lVar10) >>
                          0x1e) & ((uint)(uVar9 >> 0x1d) & 7 ^
                                  *(uint *)((long)pGVar8 +
                                           (ulong)(uint)((int)(uVar9 & 0x1fffffff) << 2) * -3 +
                                           lVar10) >> 0x1e) & 1) << 0x1e);
          }
          lVar7 = lVar7 + 1;
          lVar10 = lVar10 + 0xc;
        } while (lVar7 < p->nObjs);
      }
      pVVar5 = p->vCos;
      if (0 < pVVar5->nSize) {
        lVar10 = 0;
        do {
          iVar6 = pVVar5->pArray[lVar10];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_001da420;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar8 = p->pObjs + iVar6;
          uVar3 = (uint)*(ulong *)pGVar8;
          *(ulong *)pGVar8 =
               *(ulong *)pGVar8 & 0xffffffffbfffffff |
               (ulong)((uVar3 * 2 ^ *(uint *)(pGVar8 + -(ulong)(uVar3 & 0x1fffffff))) & 0x40000000);
          lVar10 = lVar10 + 1;
          pVVar5 = p->vCos;
        } while (lVar10 < pVVar5->nSize);
      }
      iVar6 = p->nRegs;
      if (0 < iVar6) {
        iVar4 = 0;
LAB_001da361:
        iVar1 = p->vCos->nSize;
        uVar3 = (iVar1 - iVar6) + iVar4;
        if (((int)uVar3 < 0) || (iVar1 <= (int)uVar3)) {
LAB_001da43f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = p->vCos->pArray[uVar3];
        if ((long)iVar1 < 0) {
LAB_001da420:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->nObjs <= iVar1) goto LAB_001da420;
        pGVar8 = p->pObjs;
        if (pGVar8 != (Gia_Obj_t *)0x0) {
          iVar2 = p->vCis->nSize;
          uVar3 = (iVar2 - iVar6) + iVar4;
          if (((int)uVar3 < 0) || (iVar2 <= (int)uVar3)) goto LAB_001da43f;
          iVar6 = p->vCis->pArray[uVar3];
          lVar10 = (long)iVar6;
          if ((lVar10 < 0) || (p->nObjs <= iVar6)) goto LAB_001da420;
          *(ulong *)(pGVar8 + lVar10) =
               *(ulong *)(pGVar8 + lVar10) & 0xffffffffbfffffff |
               (ulong)((uint)*(undefined8 *)(pGVar8 + iVar1) & 0x40000000);
          iVar4 = iVar4 + 1;
          iVar6 = p->nRegs;
          if (iVar4 < iVar6) goto LAB_001da361;
        }
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != nFrames);
  }
  return;
}

Assistant:

void Gia_ManCycle( Gia_Man_t * p, Abc_Cex_t * pCex, int nFrames )
{
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int i, k;
    Gia_ManRandom( 1 );
    assert( pCex == NULL || nFrames <= pCex->iFrame );
    // iterate for the given number of frames
    for ( i = 0; i < nFrames; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = pCex ? Abc_InfoHasBit(pCex->pData, pCex->nRegs+i*pCex->nPis+k) : (1 & Gia_ManRandom(0));
        Gia_ManForEachAnd( p, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( p, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
    }
}